

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O2

void __thiscall UEFITool::search(UEFITool *this)

{
  long lVar1;
  FfsFinder *this_00;
  char cVar2;
  byte bVar3;
  bool unicode;
  byte bVar4;
  int iVar5;
  storage_type *psVar6;
  storage_type *psVar7;
  long *plVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArray pattern;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  
  iVar5 = (**(code **)(*(long *)this->searchDialog + 0x1a8))();
  if (iVar5 == 1) {
    iVar5 = QTabWidget::currentIndex();
    if (iVar5 == 2) {
      QWidget::setFocus(*(QWidget **)(this->searchDialog->ui + 0xb8));
      QLineEdit::text();
      if (pattern.d.size != 0) {
        cVar2 = QAbstractButton::isChecked();
        bVar3 = 1;
        if (cVar2 == '\0') {
          bVar3 = QAbstractButton::isChecked();
          bVar3 = bVar3 ^ 3;
        }
        this_00 = this->ffsFinder;
        unicode = (bool)QAbstractButton::isChecked();
        bVar4 = QAbstractButton::isChecked();
        FfsFinder::findTextPattern(this_00,(QString *)&pattern,bVar3,unicode,(uint)bVar4);
        showFinderMessages(this);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&pattern);
    }
    else {
      if (iVar5 == 1) {
        QWidget::setFocus(*(QWidget **)(this->searchDialog->ui + 0x70));
        QLineEdit::setCursorPosition((int)*(undefined8 *)(this->searchDialog->ui + 0x70));
        QLineEdit::text();
        QString::toLatin1_helper_inplace((QString *)&pattern);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        if (pattern.d.size != 0) {
          cVar2 = QAbstractButton::isChecked();
          bVar3 = 1;
          if (cVar2 == '\0') {
            bVar3 = QAbstractButton::isChecked();
            bVar3 = bVar3 ^ 3;
          }
          FfsFinder::findGuidPattern(this->ffsFinder,&pattern,bVar3);
          showFinderMessages(this);
        }
      }
      else {
        if (iVar5 != 0) {
          return;
        }
        QWidget::setFocus(*(QWidget **)(this->searchDialog->ui + 0x28));
        QLineEdit::text();
        QString::toLatin1_helper_inplace((QString *)&local_58);
        psVar6 = (storage_type *)QByteArrayView::lengthHelperCharArray(" ",2);
        psVar7 = (storage_type *)
                 QByteArrayView::lengthHelperCharArray(anon_var_dwarf_1a2b74 + 0x10,1);
        QVar9.m_data = psVar6;
        QVar9.m_size = (qsizetype)&local_58;
        QVar10.m_data = psVar7;
        QVar10.m_size = (qsizetype)" ";
        plVar8 = (long *)QByteArray::replace(QVar9,QVar10);
        pattern.d.d = (Data *)*plVar8;
        pattern.d.ptr = (char *)plVar8[1];
        lVar1 = plVar8[2];
        if (pattern.d.d != (Data *)0x0) {
          LOCK();
          ((pattern.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((pattern.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        pattern.d.size = lVar1;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
        if (lVar1 != 0) {
          cVar2 = QAbstractButton::isChecked();
          bVar3 = 1;
          if (cVar2 == '\0') {
            bVar3 = QAbstractButton::isChecked();
            bVar3 = bVar3 ^ 3;
          }
          FfsFinder::findHexPattern(this->ffsFinder,&pattern,bVar3);
          showFinderMessages(this);
        }
      }
      QArrayDataPointer<char>::~QArrayDataPointer(&pattern.d);
    }
  }
  return;
}

Assistant:

void UEFITool::search()
{
    if (searchDialog->exec() != QDialog::Accepted)
        return;
    
    int index = searchDialog->ui->tabWidget->currentIndex();
    if (index == 0) { // Hex pattern
        searchDialog->ui->hexEdit->setFocus();
        QByteArray pattern = searchDialog->ui->hexEdit->text().toLatin1().replace(" ", "");
        if (pattern.isEmpty())
            return;
        UINT8 mode;
        if (searchDialog->ui->hexScopeHeaderRadioButton->isChecked())
            mode = SEARCH_MODE_HEADER;
        else if (searchDialog->ui->hexScopeBodyRadioButton->isChecked())
            mode = SEARCH_MODE_BODY;
        else
            mode = SEARCH_MODE_ALL;
        ffsFinder->findHexPattern(pattern, mode);
        showFinderMessages();
    }
    else if (index == 1) { // GUID
        searchDialog->ui->guidEdit->setFocus();
        searchDialog->ui->guidEdit->setCursorPosition(0);
        QByteArray pattern = searchDialog->ui->guidEdit->text().toLatin1();
        if (pattern.isEmpty())
            return;
        UINT8 mode;
        if (searchDialog->ui->guidScopeHeaderRadioButton->isChecked())
            mode = SEARCH_MODE_HEADER;
        else if (searchDialog->ui->guidScopeBodyRadioButton->isChecked())
            mode = SEARCH_MODE_BODY;
        else
            mode = SEARCH_MODE_ALL;
        ffsFinder->findGuidPattern(pattern, mode);
        showFinderMessages();
    }
    else if (index == 2) { // Text string
        searchDialog->ui->textEdit->setFocus();
        QString pattern = searchDialog->ui->textEdit->text();
        if (pattern.isEmpty())
            return;
        UINT8 mode;
        if (searchDialog->ui->textScopeHeaderRadioButton->isChecked())
            mode = SEARCH_MODE_HEADER;
        else if (searchDialog->ui->textScopeBodyRadioButton->isChecked())
            mode = SEARCH_MODE_BODY;
        else
            mode = SEARCH_MODE_ALL;
        ffsFinder->findTextPattern(pattern, mode, searchDialog->ui->textUnicodeCheckBox->isChecked(),
                                   (Qt::CaseSensitivity) searchDialog->ui->textCaseSensitiveCheckBox->isChecked());
        showFinderMessages();
    }
}